

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

Path * __thiscall Pathie::Path::expand(Path *__return_storage_ptr__,Path *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string str;
  Path homepath;
  Path path;
  Path local_b8;
  Path local_98;
  Path local_78;
  string local_58;
  Path local_38;
  
  Path(&local_78,this);
  if (*(this->m_path)._M_dataplus._M_p != '~') {
    pwd();
    absolute(&local_b8,&local_78,&local_98);
    std::__cxx11::string::_M_assign((string *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.m_path._M_dataplus._M_p != &local_b8.m_path.field_2) {
      operator_delete(local_b8.m_path._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.m_path._M_dataplus._M_p != &local_98.m_path.field_2) {
      operator_delete(local_98.m_path._M_dataplus._M_p);
    }
  }
  paVar1 = &local_b8.m_path.field_2;
  local_b8.m_path._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,local_78.m_path._M_dataplus._M_p,
             local_78.m_path._M_dataplus._M_p + local_78.m_path._M_string_length);
  if (*local_b8.m_path._M_dataplus._M_p == '~') {
    home();
    if ((local_b8.m_path._M_dataplus._M_p[1] == '/') || (local_b8.m_path._M_string_length == 1)) {
      std::__cxx11::string::replace
                ((ulong)&local_b8,0,(char *)0x1,(ulong)local_98.m_path._M_dataplus._M_p);
    }
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,local_b8.m_path._M_dataplus._M_p,
               local_b8.m_path._M_dataplus._M_p + local_b8.m_path._M_string_length);
    Path(&local_38,&local_58);
    std::__cxx11::string::_M_assign((string *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38.m_path._M_dataplus._M_p != &local_38.m_path.field_2) {
      operator_delete(local_38.m_path._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.m_path._M_dataplus._M_p != &local_98.m_path.field_2) {
      operator_delete(local_98.m_path._M_dataplus._M_p);
    }
  }
  prune(__return_storage_ptr__,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.m_path._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8.m_path._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_path._M_dataplus._M_p != &local_78.m_path.field_2) {
    operator_delete(local_78.m_path._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Path Path::expand() const
{
  Path path(*this); // copy

  if (m_path[0] != '~')
    path = path.absolute();

  std::string str = path.str();
  if (str[0] == '~') {
    Path homepath = home();

    if (str[1] == '/' || str.length() == 1) {
      // User home requested
      str.replace(0, 1, homepath.m_path);
    }

    path = Path(str);
  }

  return path.prune();
}